

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_d05a6d::HandleCacheMode
               (cmExecutionStatus *status,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names,string *propertyName,string *propertyValue,bool appendAsString,bool appendMode
               ,bool remove)

{
  _Rb_tree_node_base *key;
  bool bVar1;
  int iVar2;
  cmake *pcVar3;
  cmValue cVar4;
  cmState *this;
  _Base_ptr p_Var5;
  char *extraout_RDX;
  undefined3 in_register_00000089;
  _Rb_tree_header *p_Var6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string_view value_00;
  string local_88;
  uint local_68;
  undefined4 local_64;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  _Base_ptr local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  local_64 = CONCAT31(in_register_00000089,appendMode);
  iVar2 = std::__cxx11::string::compare((char *)propertyName);
  if (iVar2 == 0) {
    if (((remove) ||
        (value._M_str = extraout_RDX, value._M_len = (size_t)(propertyValue->_M_dataplus)._M_p,
        bVar1 = cmValue::IsOn((cmValue *)propertyValue->_M_string_length,value), bVar1)) ||
       (value_00._M_str = (propertyValue->_M_dataplus)._M_p,
       value_00._M_len = propertyValue->_M_string_length, bVar1 = cmValue::IsOff(value_00), bVar1))
    goto LAB_002cee54;
    local_48 = (propertyValue->_M_dataplus)._M_p;
    local_50 = (_Base_ptr)propertyValue->_M_string_length;
    local_60._M_len = 0x19;
    local_60._M_str = "given non-boolean value \"";
    local_40 = 0x22;
    local_38 = "\" for CACHE property \"ADVANCED\".  ";
    views_00._M_len = 3;
    views_00._M_array = &local_60;
    cmCatViews_abi_cxx11_(&local_88,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)propertyName);
    if (iVar2 == 0) {
      bVar1 = cmState::IsCacheEntryType(propertyValue);
      if (bVar1) goto LAB_002cee54;
      local_48 = (propertyValue->_M_dataplus)._M_p;
      local_50 = (_Base_ptr)propertyValue->_M_string_length;
      local_60._M_len = 0x20;
      local_60._M_str = "given invalid CACHE entry TYPE \"";
      local_40 = 1;
      local_38 = "\"";
      views_02._M_len = 3;
      views_02._M_array = &local_60;
      cmCatViews_abi_cxx11_(&local_88,views_02);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)propertyName);
      if (((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)propertyName), iVar2 == 0)
          ) || (iVar2 = std::__cxx11::string::compare((char *)propertyName), iVar2 == 0)) {
LAB_002cee54:
        p_Var5 = (names->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var6 = &(names->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var5 != p_Var6) {
          local_68 = (uint)appendAsString;
          do {
            key = p_Var5 + 1;
            pcVar3 = cmMakefile::GetCMakeInstance(status->Makefile);
            cVar4 = cmState::GetCacheEntryValue
                              ((pcVar3->State)._M_t.
                               super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                               super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                               super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)key);
            if (cVar4.Value == (string *)0x0) {
              local_48 = *(pointer *)(p_Var5 + 1);
              local_50 = p_Var5[1]._M_parent;
              local_60._M_len = 0x1e;
              local_60._M_str = "could not find CACHE variable ";
              local_40 = 0x27;
              local_38 = ".  Perhaps it has not yet been created.";
              views_01._M_len = 3;
              views_01._M_array = &local_60;
              cmCatViews_abi_cxx11_(&local_88,views_01);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002cefbe;
            }
            this = cmMakefile::GetState(status->Makefile);
            if (remove) {
              cmState::RemoveCacheEntryProperty(this,(string *)key,propertyName);
            }
            if ((char)local_64 == '\0') {
              cmState::SetCacheEntryProperty(this,(string *)key,propertyName,propertyValue);
            }
            else {
              cmState::AppendCacheEntryProperty
                        (this,(string *)key,propertyName,propertyValue,SUB41(local_68,0));
            }
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
          } while ((_Rb_tree_header *)p_Var5 != p_Var6);
        }
        return true;
      }
      local_48 = (propertyName->_M_dataplus)._M_p;
      local_50 = (_Base_ptr)propertyName->_M_string_length;
      local_60._M_len = 0x1d;
      local_60._M_str = "given invalid CACHE property ";
      local_40 = 0x51;
      local_38 = ".  Settable CACHE properties are: ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE."
      ;
      views._M_len = 3;
      views._M_array = &local_60;
      cmCatViews_abi_cxx11_(&local_88,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
LAB_002cefbe:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool HandleCacheMode(cmExecutionStatus& status,
                     const std::set<std::string>& names,
                     const std::string& propertyName,
                     const std::string& propertyValue, bool appendAsString,
                     bool appendMode, bool remove)
{
  if (propertyName == "ADVANCED") {
    if (!remove && !cmIsOn(propertyValue) && !cmIsOff(propertyValue)) {
      status.SetError(cmStrCat("given non-boolean value \"", propertyValue,
                               R"(" for CACHE property "ADVANCED".  )"));
      return false;
    }
  } else if (propertyName == "TYPE") {
    if (!cmState::IsCacheEntryType(propertyValue)) {
      status.SetError(
        cmStrCat("given invalid CACHE entry TYPE \"", propertyValue, "\""));
      return false;
    }
  } else if (propertyName != "HELPSTRING" && propertyName != "STRINGS" &&
             propertyName != "VALUE") {
    status.SetError(
      cmStrCat("given invalid CACHE property ", propertyName,
               ".  "
               "Settable CACHE properties are: "
               "ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE."));
    return false;
  }

  for (std::string const& name : names) {
    // Get the source file.
    cmake* cm = status.GetMakefile().GetCMakeInstance();
    cmValue existingValue = cm->GetState()->GetCacheEntryValue(name);
    if (existingValue) {
      if (!HandleCacheEntry(name, status.GetMakefile(), propertyName,
                            propertyValue, appendAsString, appendMode,
                            remove)) {
        return false;
      }
    } else {
      status.SetError(cmStrCat("could not find CACHE variable ", name,
                               ".  Perhaps it has not yet been created."));
      return false;
    }
  }
  return true;
}